

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int aec_decode_end(aec_stream_conflict *strm)

{
  internal_state_conflict *__ptr;
  internal_state_conflict *state;
  aec_stream_conflict *strm_local;
  
  __ptr = strm->state;
  if (__ptr->offsets != (vector_t *)0x0) {
    vector_destroy(__ptr->offsets);
  }
  free(__ptr->id_table);
  free(__ptr->rsi_buffer);
  free(__ptr);
  return 0;
}

Assistant:

int aec_decode_end(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    if (state->offsets != NULL)
        vector_destroy(state->offsets);

    free(state->id_table);
    free(state->rsi_buffer);
    free(state);

    return AEC_OK;
}